

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O3

Gia_Man_t * Gia_ManMaxiUnfold(Gia_Man_t *p,int nFrames,int fUseVars,Vec_Int_t *vInit)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  
  p_00 = Gia_ManStart(p->nObjs * nFrames + p->nRegs * fUseVars * 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  uVar8 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    iVar14 = 0;
    do {
      iVar5 = p->vCis->nSize;
      uVar11 = (iVar5 - (int)uVar8) + iVar14;
      if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) goto LAB_005b34e6;
      iVar5 = p->vCis->pArray[uVar11];
      if ((iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005b34a8;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_005b34c7;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_005b34c7;
      iVar14 = iVar14 + 1;
      uVar8 = (ulong)(uint)p->nRegs;
    } while (iVar14 < p->nRegs);
    if (0 < (int)uVar8) {
      iVar14 = 0;
      do {
        iVar5 = p->vCis->nSize;
        uVar11 = (iVar5 - (int)uVar8) + iVar14;
        if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) goto LAB_005b34e6;
        iVar5 = p->vCis->pArray[uVar11];
        if ((iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005b34a8;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar8 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_005b34c7;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_005b34c7;
        iVar14 = iVar14 + 1;
        uVar8 = (ulong)(uint)p->nRegs;
      } while (iVar14 < p->nRegs);
    }
  }
  if ((vInit != (Vec_Int_t *)0x0) && (vInit->nSize != (int)uVar8)) {
    __assert_fail("!vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                  ,0x54,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
  }
  if (0 < (int)uVar8) {
    lVar16 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar12 = (ulong)(uint)(iVar14 - (int)uVar8) + lVar16;
      iVar5 = (int)uVar12;
      if ((iVar5 < 0) || (iVar14 <= iVar5)) goto LAB_005b34e6;
      iVar14 = p->vCis->pArray[uVar12 & 0xffffffff];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_005b34a8;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vInit->nSize <= lVar16) goto LAB_005b34e6;
      uVar11 = p_00->vCis->nSize;
      if ((int)uVar11 <= lVar16) goto LAB_005b34e6;
      piVar3 = p_00->vCis->pArray;
      iVar5 = piVar3[lVar16];
      if ((long)iVar5 < 0) goto LAB_005b34a8;
      uVar15 = p_00->nObjs;
      if ((int)uVar15 <= iVar5) goto LAB_005b34a8;
      pGVar7 = p_00->pObjs;
      pGVar18 = (Gia_Obj_t *)((ulong)(pGVar7 + iVar5) & 0xfffffffffffffffe);
      if ((pGVar18 < pGVar7) || (pGVar7 + uVar15 <= pGVar18)) goto LAB_005b34c7;
      iVar17 = (int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2);
      if (iVar17 * -0x55555555 < 0) {
LAB_005b3543:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar8 = (uVar8 & 0xffffffff) + lVar16;
      if (uVar11 <= uVar8) goto LAB_005b34e6;
      uVar11 = piVar3[uVar8];
      if (((long)(int)uVar11 < 0) || (uVar15 <= uVar11)) goto LAB_005b34a8;
      pGVar18 = (Gia_Obj_t *)((ulong)(pGVar7 + (int)uVar11) & 0xfffffffffffffffe);
      if ((pGVar18 < pGVar7) || (pGVar7 + uVar15 <= pGVar18)) goto LAB_005b34c7;
      iVar19 = (int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2);
      if (iVar19 * -0x55555555 < 0) goto LAB_005b3543;
      if (5 < (uint)vInit->pArray[lVar16]) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                      ,0x67,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
      }
      uVar15 = ((uint)(pGVar7 + iVar5) & 1) + iVar17 * 0x55555556;
      iVar5 = ((uint)(pGVar7 + (int)uVar11) & 1) + iVar19 * 0x55555556;
      uVar11 = 0;
      switch(vInit->pArray[lVar16]) {
      case 0:
        uVar11 = 0;
        if (fUseVars != 0) goto switchD_005b2ec2_caseD_2;
        break;
      case 1:
        if (fUseVars == 0) goto switchD_005b2ec2_caseD_5;
      case 3:
        uVar11 = Gia_ManHashOr(p_00,uVar15 ^ 1,iVar5);
        break;
      case 2:
switchD_005b2ec2_caseD_2:
        uVar11 = Gia_ManHashAnd(p_00,uVar15,iVar5);
        break;
      case 5:
switchD_005b2ec2_caseD_5:
        uVar11 = 1;
      }
      pGVar2[iVar14].Value = uVar11;
      lVar16 = lVar16 + 1;
      uVar8 = (ulong)p->nRegs;
    } while (lVar16 < (long)uVar8);
  }
  if (0 < nFrames) {
    iVar14 = 0;
    do {
      pVVar10 = p->vCis;
      iVar5 = pVVar10->nSize;
      if ((int)uVar8 < iVar5) {
        lVar16 = 0;
        do {
          if (iVar5 <= lVar16) goto LAB_005b34e6;
          iVar5 = pVVar10->pArray[lVar16];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005b34a8;
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          pGVar18 = Gia_ManAppendObj(p_00);
          uVar8 = *(ulong *)pGVar18;
          *(ulong *)pGVar18 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar18 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p_00->pObjs;
          if ((pGVar18 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar18)) goto LAB_005b34c7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p_00->pObjs;
          if ((pGVar18 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar18)) goto LAB_005b34c7;
          pGVar2[iVar5].Value = (int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2) * 0x55555556;
          lVar16 = lVar16 + 1;
          uVar8 = (ulong)(uint)p->nRegs;
          pVVar10 = p->vCis;
          iVar5 = pVVar10->nSize;
        } while (lVar16 < iVar5 - p->nRegs);
      }
      uVar11 = p->nObjs;
      if (0 < (int)uVar11) {
        lVar21 = 8;
        lVar16 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar8 = *(ulong *)((long)pGVar2 + lVar21 + -8);
          if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
            uVar11 = *(uint *)((long)pGVar2 +
                              lVar21 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3);
            if (((int)uVar11 < 0) ||
               (uVar15 = *(uint *)((long)pGVar2 +
                                  lVar21 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar15 < 0)) goto LAB_005b3505;
            iVar5 = Gia_ManHashAnd(p_00,uVar11 ^ (uint)(uVar8 >> 0x1d) & 1,
                                   uVar15 ^ (uint)(uVar8 >> 0x3d) & 1);
            *(int *)(&pGVar2->field_0x0 + lVar21) = iVar5;
            uVar11 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar21 = lVar21 + 0xc;
        } while (lVar16 < (int)uVar11);
        uVar8 = (ulong)(uint)p->nRegs;
      }
      iVar5 = (int)uVar8;
      if (0 < iVar5) {
        pVVar10 = p->vCos;
        iVar17 = pVVar10->nSize;
        uVar20 = (ulong)(uint)(iVar17 - iVar5);
        uVar13 = uVar8 & 0xffffffff;
        uVar12 = uVar13;
        do {
          if (((int)uVar20 < 0) || (iVar17 <= (int)uVar20)) goto LAB_005b34e6;
          iVar19 = pVVar10->pArray[uVar20];
          if (((long)iVar19 < 0) || ((int)uVar11 <= iVar19)) goto LAB_005b34a8;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar19;
          if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_005b3505:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar2->Value =
               (uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
               pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value;
          uVar20 = uVar20 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        if (0 < iVar5) {
          pVVar10 = p->vCis;
          iVar17 = pVVar10->nSize;
          uVar12 = (ulong)(uint)(iVar17 - iVar5);
          do {
            if (((int)uVar12 < 0) || (iVar17 <= (int)uVar12)) goto LAB_005b34e6;
            iVar19 = pVVar10->pArray[uVar12];
            if (((long)iVar19 < 0) || ((int)uVar11 <= iVar19)) goto LAB_005b34a8;
            pGVar2 = p->pObjs;
            if (pGVar2 == (Gia_Obj_t *)0x0) break;
            uVar4 = *(undefined8 *)(pGVar2 + iVar19);
            if ((((uint)uVar4 & 0x9fffffff) != 0x9fffffff) ||
               (uVar15 = (uint)((ulong)uVar4 >> 0x20) & 0x1fffffff, (int)uVar15 < iVar17 - iVar5)) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar1 = p->vCos->nSize;
            uVar15 = (iVar1 - iVar17) + uVar15;
            if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_005b34e6;
            uVar15 = p->vCos->pArray[uVar15];
            if (((long)(int)uVar15 < 0) || (uVar11 <= uVar15)) goto LAB_005b34a8;
            pGVar2[iVar19].Value = pGVar2[(int)uVar15].Value;
            uVar12 = uVar12 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != nFrames);
  }
  if (0 < (int)uVar8) {
    iVar14 = 0;
    do {
      iVar5 = p->vCos->nSize;
      uVar11 = (iVar5 - (int)uVar8) + iVar14;
      if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) {
LAB_005b34e6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar11];
      lVar16 = (long)iVar5;
      if ((lVar16 < 0) || (p->nObjs <= iVar5)) {
LAB_005b34a8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar11 = pGVar2[lVar16].Value;
      if ((int)uVar11 < 0) {
LAB_005b3562:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar15 = uVar11 >> 1;
      if (p_00->nObjs <= (int)uVar15) goto LAB_005b3562;
      if ((~*(uint *)(p_00->pObjs + uVar15) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar15) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar18 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar18;
      *(ulong *)pGVar18 = uVar8 | 0x80000000;
      pGVar7 = p_00->pObjs;
      if ((pGVar18 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar18)) {
LAB_005b34c7:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar12 = (ulong)(((uint)((int)pGVar18 - (int)pGVar7) >> 2) * -0x55555555 - uVar15 & 0x1fffffff
                      );
      uVar13 = (ulong)((uVar11 & 1) << 0x1d);
      *(ulong *)pGVar18 = uVar13 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar12;
      *(ulong *)pGVar18 =
           uVar13 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar12 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar18 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar18)) goto LAB_005b34c7;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar18 + -(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff),pGVar18)
        ;
      }
      pGVar7 = p_00->pObjs;
      if ((pGVar18 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar18)) goto LAB_005b34c7;
      pGVar2[lVar16].Value = (int)((ulong)((long)pGVar18 - (long)pGVar7) >> 2) * 0x55555556;
      iVar14 = iVar14 + 1;
      uVar8 = (ulong)(uint)p->nRegs;
    } while (iVar14 < p->nRegs);
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (pGVar9->vCis->nSize - pGVar9->nRegs == (p->vCis->nSize - p->nRegs) * nFrames + p->nRegs * 2) {
    return pGVar9;
  }
  __assert_fail("Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                ,0x78,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManMaxiUnfold( Gia_Man_t * p, int nFrames, int fUseVars, Vec_Int_t * vInit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, f;
    pNew = Gia_ManStart( fUseVars * 2 * Gia_ManRegNum(p) + nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // control/data variables
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    // build timeframes
    assert( !vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        int Value = Vec_IntEntry( vInit, i );
        int iCtrl = Gia_ManCiLit( pNew, i );
        int iData = Gia_ManCiLit( pNew, Gia_ManRegNum(p)+i );
        // decide based on Value
        if ( Value == 0 )
            pObj->Value = fUseVars ? Gia_ManHashAnd(pNew, iCtrl, iData) : 0;
        else if ( Value == 1 )
            pObj->Value = fUseVars ? Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData) : 1;
        else if ( Value == 2 )
            pObj->Value = Gia_ManHashAnd(pNew, iCtrl, iData);
        else if ( Value == 3 )
            pObj->Value = Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData);
        else if ( Value == 4 )
            pObj->Value = 0;
        else if ( Value == 5 )
            pObj->Value = 1;
        else assert( 0 );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRo( p, pObj, i )
            pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p) );
    return pNew;
}